

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_binder.cpp
# Opt level: O3

void __thiscall
duckdb::GroupBinder::GroupBinder
          (GroupBinder *this,Binder *binder,ClientContext *context,SelectNode *node,
          idx_t group_index,SelectBindState *bind_state,
          case_insensitive_map_t<idx_t> *group_alias_map)

{
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder = (_func_int **)&PTR__GroupBinder_0197d610;
  (this->unbound_expression).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  this->node = node;
  this->bind_state = bind_state;
  this->group_alias_map = group_alias_map;
  (this->used_aliases)._M_h._M_buckets = &(this->used_aliases)._M_h._M_single_bucket;
  (this->used_aliases)._M_h._M_bucket_count = 1;
  (this->used_aliases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used_aliases)._M_h._M_element_count = 0;
  (this->used_aliases)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used_aliases)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used_aliases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->group_index = group_index;
  return;
}

Assistant:

GroupBinder::GroupBinder(Binder &binder, ClientContext &context, SelectNode &node, idx_t group_index,
                         SelectBindState &bind_state, case_insensitive_map_t<idx_t> &group_alias_map)
    : ExpressionBinder(binder, context), node(node), bind_state(bind_state), group_alias_map(group_alias_map),
      group_index(group_index) {
}